

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

Mio_Cell2_t * Mio_CollectRootsNew2(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  Mio_Cell2_t *__ptr;
  void *__ptr_00;
  char **ppcVar7;
  float fVar8;
  uint local_7c;
  Mio_Cell2_t *pCell_1;
  int *pCounts;
  int Idx_1;
  int Idx;
  int iCell;
  int iCell0;
  int nGates;
  int i;
  Mio_Cell2_t *pCell;
  Mio_Cell2_t *ppCells;
  Mio_Cell2_t *ppCells0;
  Mio_Gate_t *pGate0;
  int fVerbose_local;
  int *pnGates_local;
  int nInputs_local;
  Mio_Library_t *pLib_local;
  
  Idx = 0;
  Idx_1 = 4;
  iVar5 = Mio_LibraryReadGateNum(pLib);
  pLib_local = (Mio_Library_t *)calloc((long)(iVar5 + 4),0x50);
  __ptr = (Mio_Cell2_t *)calloc((long)iVar5,0x50);
  for (ppCells0 = (Mio_Cell2_t *)Mio_LibraryReadGates(pLib); ppCells0 != (Mio_Cell2_t *)0x0;
      ppCells0 = (Mio_Cell2_t *)Mio_GateReadNext((Mio_Gate_t *)ppCells0)) {
    if ((*(int *)&ppCells0->field_0x44 <= nInputs) && (*(long *)(ppCells0->iDelays + 3) == 0)) {
      Mio_CollectCopy2(__ptr + Idx,(Mio_Gate_t *)ppCells0);
      Idx = Idx + 1;
    }
  }
  _nGates = __ptr;
  if (iVar5 < Idx) {
    __assert_fail("iCell0 <= nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x2b0,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
  }
  do {
    if (__ptr + Idx <= _nGates) {
      if (__ptr != (Mio_Cell2_t *)0x0) {
        free(__ptr);
      }
      if (pLib_local->pName == (char *)0x0) {
        printf("Error: Cannot find constant 0 gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else if (pLib_local->pGateAnd2 == (Mio_Gate_t *)0x0) {
        printf("Error: Cannot find constant 1 gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else if (pLib_local->pCells == (Mio_Cell2_t *)0x0) {
        printf("Error: Cannot find buffer gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else if (pLib_local->vTt2Match2[1] == (Vec_Int_t *)0x0) {
        printf("Error: Cannot find inverter gate in the library.\n");
        pLib_local = (Mio_Library_t *)0x0;
      }
      else {
        if (5 < Idx_1) {
          qsort(&pLib_local[1].pGateInv,(long)(Idx_1 + -4),0x50,Mio_AreaCompare2);
          iVar6 = Mio_AreaCompare2((Mio_Cell2_t *)&pLib_local[1].pGateInv,
                                   (Mio_Cell2_t *)((long)pLib_local + (long)Idx_1 * 0x50 + -0x50));
          if (0 < iVar6) {
            __assert_fail("Mio_AreaCompare2( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x2de,
                          "Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)");
          }
        }
        for (ppCells0 = (Mio_Cell2_t *)Mio_LibraryReadGates(pLib); ppCells0 != (Mio_Cell2_t *)0x0;
            ppCells0 = (Mio_Cell2_t *)Mio_GateReadNext((Mio_Gate_t *)ppCells0)) {
          Mio_GateSetCell((Mio_Gate_t *)ppCells0,-1);
        }
        for (iCell0 = 0; iCell0 < Idx_1; iCell0 = iCell0 + 1) {
          if ((&pLib_local->pName)[(long)iCell0 * 10] == (char *)0x0) {
            local_7c = 0xffffffff;
          }
          else {
            local_7c = iCell0;
          }
          *(uint *)(&pLib_local->ppGates0 + (long)iCell0 * 10) =
               *(uint *)(&pLib_local->ppGates0 + (long)iCell0 * 10) & 0xfc000000 |
               local_7c & 0x3ffffff;
          Mio_GateSetCell((&pLib_local->pGateNand2)[(long)iCell0 * 10],iCell0);
        }
        if (fVerbose != 0) {
          __ptr_00 = calloc((long)(iVar5 + 4),4);
          for (ppCells0 = (Mio_Cell2_t *)Mio_LibraryReadGates(pLib); ppCells0 != (Mio_Cell2_t *)0x0;
              ppCells0 = (Mio_Cell2_t *)Mio_GateReadNext((Mio_Gate_t *)ppCells0)) {
            if ((*(int *)&ppCells0->field_0x44 <= nInputs) &&
               (*(long *)(ppCells0->iDelays + 3) == 0)) {
              for (iCell0 = 0; iCell0 < Idx_1; iCell0 = iCell0 + 1) {
                if (((&pLib_local->pName)[(long)iCell0 * 10] != (char *)0x0) &&
                   ((&pLib_local->pGates)[(long)iCell0 * 10] == (Mio_Gate_t *)ppCells0[1].AreaW)) {
                  *(int *)((long)__ptr_00 + (long)iCell0 * 4) =
                       *(int *)((long)__ptr_00 + (long)iCell0 * 4) + 1;
                  break;
                }
              }
              if (Idx_1 <= iCell0) {
                __assert_fail("i < iCell",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                              ,0x2f8,
                              "Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)")
                ;
              }
            }
          }
          for (iCell0 = 0; iCell0 < Idx_1; iCell0 = iCell0 + 1) {
            ppcVar7 = &pLib_local->pName + (long)iCell0 * 10;
            printf("%4d : ",(ulong)(uint)iCell0);
            if (*ppcVar7 == (char *)0x0) {
              printf("None\n");
            }
            else {
              pcVar4 = *ppcVar7;
              uVar2 = *(uint *)(ppcVar7 + 2);
              uVar3 = *(uint *)((long)__ptr_00 + (long)iCell0 * 4);
              fVar1 = *(float *)((long)ppcVar7 + 0x14);
              fVar8 = Scl_Int2Flt(*(int *)(ppcVar7 + 5));
              printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",(double)fVar1,
                     (double)fVar8,pcVar4,(ulong)(uVar2 >> 0x1c),(ulong)uVar3);
            }
          }
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
          }
        }
        if (pnGates != (int *)0x0) {
          *pnGates = Idx_1;
        }
      }
      return (Mio_Cell2_t *)pLib_local;
    }
    for (iCell0 = 0; iCell0 < Idx_1; iCell0 = iCell0 + 1) {
      if (((&pLib_local->pName)[(long)iCell0 * 10] != (char *)0x0) &&
         ((&pLib_local->pGates)[(long)iCell0 * 10] == (Mio_Gate_t *)_nGates->uTruth)) {
        iVar6 = Mio_CompareTwo2((Mio_Cell2_t *)(&pLib_local->pName + (long)iCell0 * 10),_nGates);
        if (iVar6 != 0) {
          memcpy(&pLib_local->pName + (long)iCell0 * 10,_nGates,0x50);
        }
        break;
      }
    }
    if (Idx_1 <= iCell0) {
      if ((_nGates->uTruth == 0) || (_nGates->uTruth == 0xffffffffffffffff)) {
        if (*(uint *)&_nGates->field_0x10 >> 0x1c != 0) {
          __assert_fail("pCell->nFanins == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x2c3,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)"
                       );
        }
        memcpy(&pLib_local->pName + (long)(int)(uint)(_nGates->uTruth == 0xffffffffffffffff) * 10,
               _nGates,0x50);
      }
      else if ((_nGates->uTruth == 0xaaaaaaaaaaaaaaaa) || (_nGates->uTruth == 0x5555555555555555)) {
        if (*(uint *)&_nGates->field_0x10 >> 0x1c != 1) {
          __assert_fail("pCell->nFanins == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x2ca,"Mio_Cell2_t *Mio_CollectRootsNew2(Mio_Library_t *, int, int *, int)"
                       );
        }
        memcpy(&pLib_local->pName + (long)(int)((_nGates->uTruth == 0x5555555555555555) + 2) * 10,
               _nGates,0x50);
      }
      else {
        memcpy(&pLib_local->pName + (long)Idx_1 * 10,_nGates,0x50);
        Idx_1 = Idx_1 + 1;
      }
    }
    _nGates = _nGates + 1;
  } while( true );
}

Assistant:

Mio_Cell2_t * Mio_CollectRootsNew2( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate0;
    Mio_Cell2_t * ppCells0, * ppCells, * pCell;
    int i, nGates, iCell0 = 0, iCell = 4;
    // create space for new cells
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells  = ABC_CALLOC( Mio_Cell2_t, nGates + 4 );
    // copy all gates first
    ppCells0 = ABC_CALLOC( Mio_Cell2_t, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        if ( !(pGate0->nInputs > nInputs || pGate0->pTwin) ) // skip large and multi-output
            Mio_CollectCopy2( ppCells0 + iCell0++, pGate0 );
    assert( iCell0 <= nGates );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    for ( pCell = ppCells0; pCell < ppCells0 + iCell0; pCell++ )
    {
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pCell->uTruth )
            {
                if ( Mio_CompareTwo2( ppCells + i, pCell ) )
                    ppCells[i] = *pCell;
                break;
            }
        if ( i < iCell )
            continue;
        if ( pCell->uTruth == 0 || pCell->uTruth == ~(word)0 )
        {
            int Idx = (int)(pCell->uTruth == ~(word)0);
            assert( pCell->nFanins == 0 );
            ppCells[Idx] = *pCell;
            continue;
        }
        if ( pCell->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pCell->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pCell->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pCell->nFanins == 1 );
            ppCells[Idx] = *pCell;
            continue;
        }
        ppCells[iCell++] = *pCell;
    }
    ABC_FREE( ppCells0 );
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell2_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare2 );
        assert( Mio_AreaCompare2( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    Mio_LibraryForEachGate( pLib, pGate0 )
        Mio_GateSetCell( pGate0, -1 );
    for ( i = 0; i < iCell; i++ )
    {
        ppCells[i].Id = ppCells[i].pName ? i : -1;
        Mio_GateSetCell( (Mio_Gate_t *)ppCells[i].pMioGate, i );
    }

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate0 )
        {
            if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate0->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell2_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->AreaF, Scl_Int2Flt(pCell->iDelayAve) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}